

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImfTiledInputFile.cpp
# Opt level: O0

void __thiscall Imf_3_3::TiledInputFile::Data::Data(Data *this,Context *ctxt,int pN,int nT)

{
  undefined4 in_ECX;
  undefined4 in_EDX;
  undefined8 in_RSI;
  undefined8 *in_RDI;
  Compression in_stack_0000001c;
  int in_stack_00000038;
  int in_stack_0000003c;
  Header *in_stack_00000040;
  Vec2<float> local_20 [4];
  
  *in_RDI = in_RSI;
  *(undefined4 *)(in_RDI + 1) = in_EDX;
  *(undefined4 *)((long)in_RDI + 0xc) = in_ECX;
  Imath_3_1::Vec2<float>::Vec2(local_20,0.0,0.0);
  Header::Header(in_stack_00000040,in_stack_0000003c,in_stack_00000038,this._4_4_,(V2f *)ctxt,
                 (float)pN,nT,in_stack_0000001c);
  *(undefined1 *)(in_RDI + 9) = 0;
  *(undefined4 *)((long)in_RDI + 0x4c) = 0;
  *(undefined4 *)(in_RDI + 10) = 0;
  *(undefined4 *)((long)in_RDI + 0x54) = 3;
  *(undefined4 *)(in_RDI + 0xb) = 2;
  *(undefined4 *)((long)in_RDI + 0x5c) = 0;
  *(undefined4 *)(in_RDI + 0xc) = 0;
  std::vector<char,_std::allocator<char>_>::vector((vector<char,_std::allocator<char>_> *)0x1b4595);
  FrameBuffer::FrameBuffer((FrameBuffer *)0x1b45a6);
  std::vector<Imf_3_3::Slice,_std::allocator<Imf_3_3::Slice>_>::vector
            ((vector<Imf_3_3::Slice,_std::allocator<Imf_3_3::Slice>_> *)0x1b45b7);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)0x1b45c8);
  std::mutex::mutex((mutex *)0x1b45d9);
  return;
}

Assistant:

Data (Context *ctxt, int pN, int nT)
    : _ctxt (ctxt)
    , partNumber (pN)
    , numThreads (nT)
    {}